

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
               (unsigned_short *ldata,unsigned_short *rdata,unsigned_short *result_data,
               SelectionVector *lsel,SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,
               ValidityMask *rvalidity,ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  unsigned_short uVar2;
  SelectionVector *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  ValidityMask *in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  unsigned_short rentry_1;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  unsigned_short lentry_1;
  idx_t i_1;
  unsigned_short rentry;
  unsigned_short lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  ValidityMask *in_stack_ffffffffffffff88;
  ValidityMask *mask;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  ulong local_60;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_60 = 0; local_60 < in_R9; local_60 = local_60 + 1) {
      mask = in_RDI;
      SelectionVector::get_index(in_RCX,local_60);
      uVar3 = in_RSI;
      SelectionVector::get_index(in_R8,local_60);
      uVar2 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::BitwiseOROperator,unsigned_short,unsigned_short,unsigned_short>
                        (SUB81((ulong)uVar3 >> 0x38,0),(unsigned_short)((ulong)uVar3 >> 0x20),
                         (unsigned_short)((ulong)uVar3 >> 0x10),mask,0xe515a1);
      *(unsigned_short *)(in_RDX + local_60 * 2) = uVar2;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)
                         CONCAT26(in_stack_ffffffffffffff9e,
                                  CONCAT24(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
                         (idx_t)in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)
                             CONCAT26(in_stack_ffffffffffffff9e,
                                      CONCAT24(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
                             ,(idx_t)in_stack_ffffffffffffff90), bVar1)) {
        uVar2 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::BitwiseOROperator,unsigned_short,unsigned_short,unsigned_short>
                          (SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0),
                           (unsigned_short)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (unsigned_short)((ulong)in_stack_ffffffffffffff90 >> 0x10),
                           in_stack_ffffffffffffff88,0xe514c8);
        *(unsigned_short *)(in_RDX + local_40 * 2) = uVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}